

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QSet<QTabBar_*> __thiscall QDockAreaLayoutInfo::usedTabBars(QDockAreaLayoutInfo *this)

{
  QDockAreaLayoutInfo *in_RSI;
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  QTabBar *copy;
  QHashDummyValue local_39;
  QTabBar *local_38;
  Data *local_30;
  
  local_30 = *(Data **)(in_FS_OFFSET + 0x28);
  this->sep = (int *)0x0;
  if (in_RSI->tabbed == true) {
    updateTabBar(in_RSI);
    local_38 = in_RSI->tabBar;
    QHash<QTabBar*,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QTabBar*,QHashDummyValue> *)this,&stack0xffffffffffffffc8,&local_39);
  }
  if ((in_RSI->item_list).d.size != 0) {
    lVar1 = 8;
    uVar2 = 0;
    do {
      if (*(long *)((long)&((in_RSI->item_list).d.ptr)->widgetItem + lVar1) != 0) {
        usedTabBars((QDockAreaLayoutInfo *)&stack0xffffffffffffffc8);
        QSet<QTabBar_*>::unite((QSet<QTabBar_*> *)this,(QSet<QTabBar_*> *)&stack0xffffffffffffffc8);
        QHash<QTabBar_*,_QHashDummyValue>::~QHash
                  ((QHash<QTabBar_*,_QHashDummyValue> *)&stack0xffffffffffffffc8);
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x28;
    } while (uVar2 < (ulong)(in_RSI->item_list).d.size);
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSet<QTabBar_*>)(Hash)this;
  }
  __stack_chk_fail();
}

Assistant:

QSet<QTabBar*> QDockAreaLayoutInfo::usedTabBars() const
{
    QSet<QTabBar*> result;

    if (tabbed) {
        updateTabBar();
        result.insert(tabBar);
    }

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.subinfo != nullptr)
            result += item.subinfo->usedTabBars();
    }

    return result;
}